

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForLoopStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::SyntaxNode> *args_4,Token *args_5,
          ExpressionSyntax **args_6,Token *args_7,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_8,Token *args_9,
          StatementSyntax *args_10)

{
  Token closeParen;
  Token forKeyword;
  Token openParen;
  Token semi1;
  Token semi2;
  ForLoopStatementSyntax *pFVar1;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  Info *unaff_RBX;
  Info *in_RSI;
  undefined8 in_RDI;
  Info *in_R8;
  undefined8 in_R9;
  ExpressionSyntax *unaff_R12;
  undefined8 unaff_R13;
  Info *unaff_R14;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *unaff_R15;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  StatementSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  BumpAllocator *in_stack_ffffffffffffff18;
  
  pFVar1 = (ForLoopStatementSyntax *)
           allocate(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  forKeyword.info = in_R8;
  forKeyword.kind = (short)in_R9;
  forKeyword._2_1_ = (char)((ulong)in_R9 >> 0x10);
  forKeyword.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  forKeyword.rawLen = (int)((ulong)in_R9 >> 0x20);
  openParen.info = in_RSI;
  openParen.kind = (short)in_RDX;
  openParen._2_1_ = (char)((ulong)in_RDX >> 0x10);
  openParen.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  openParen.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi1.info = unaff_RBX;
  semi1.kind = (short)in_RDI;
  semi1._2_1_ = (char)((ulong)in_RDI >> 0x10);
  semi1.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  semi1.rawLen = (int)((ulong)in_RDI >> 0x20);
  semi2.info = unaff_R14;
  semi2.kind = (short)unaff_R13;
  semi2._2_1_ = (char)((ulong)unaff_R13 >> 0x10);
  semi2.numFlags.raw = (char)((ulong)unaff_R13 >> 0x18);
  semi2.rawLen = (int)((ulong)unaff_R13 >> 0x20);
  closeParen.info = in_stack_00000008;
  closeParen.kind = (short)unaff_retaddr;
  closeParen._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  closeParen.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::ForLoopStatementSyntax::ForLoopStatementSyntax
            ((ForLoopStatementSyntax *)in_RCX[1],(NamedLabelSyntax *)*in_RCX,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_R8->location,forKeyword,
             openParen,(SeparatedSyntaxList<slang::syntax::SyntaxNode> *)in_R8->rawTextPtr,semi1,
             unaff_R12,semi2,unaff_R15,closeParen,in_stack_00000010);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }